

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O1

StringRef getArchSynonym(StringRef Arch)

{
  size_t sVar1;
  size_t sVar2;
  long *plVar3;
  long *plVar4;
  bool bVar5;
  StringRef SVar6;
  
  sVar1 = Arch.Length;
  plVar3 = (long *)Arch.Data;
  if (sVar1 == 2) {
    bVar5 = (short)*plVar3 == 0x3576;
  }
  else {
    bVar5 = false;
  }
  sVar2 = 3;
  plVar4 = (long *)0x1e103b;
  if (((sVar1 == 3) && (!bVar5)) && (*(char *)((long)plVar3 + 2) == 'e' && (short)*plVar3 == 0x3576)
     ) {
    bVar5 = true;
    sVar2 = 4;
    plVar4 = (long *)0x1e1048;
  }
  if (((sVar1 == 3) && (!bVar5)) && (*(char *)((long)plVar3 + 2) == 'j' && (short)*plVar3 == 0x3676)
     ) {
    bVar5 = true;
    sVar2 = 2;
    plVar4 = (long *)0x1e1066;
  }
  if (((sVar1 == 4) && (!bVar5)) && ((int)*plVar3 == 0x6c683676)) {
    bVar5 = true;
    sVar2 = 3;
    plVar4 = (long *)0x1e106c;
  }
  if (((sVar1 == 3) && (!bVar5)) && (*(char *)((long)plVar3 + 2) == 'm' && (short)*plVar3 == 0x3676)
     ) {
    bVar5 = true;
    sVar2 = 4;
    plVar4 = (long *)0x1e108e;
  }
  if (((sVar1 == 4) && (!bVar5)) && ((int)*plVar3 == 0x6d733676)) {
    bVar5 = true;
    sVar2 = 4;
    plVar4 = (long *)0x1e108e;
  }
  if (((sVar1 == 5) && (!bVar5)) &&
     (*(char *)((long)plVar3 + 4) == 'm' && (int)*plVar3 == 0x2d733676)) {
    bVar5 = true;
    sVar2 = 4;
    plVar4 = (long *)0x1e108e;
  }
  if (((sVar1 == 3) && (!bVar5)) && (*(char *)((long)plVar3 + 2) == 'z' && (short)*plVar3 == 0x3676)
     ) {
    bVar5 = true;
    sVar2 = 4;
    plVar4 = (long *)0x1e1082;
  }
  if (((sVar1 == 4) && (!bVar5)) && ((int)*plVar3 == 0x6b7a3676)) {
    bVar5 = true;
    sVar2 = 4;
    plVar4 = (long *)0x1e1082;
  }
  if (((sVar1 == 2) && (!bVar5)) && ((short)*plVar3 == 0x3776)) {
    bVar5 = true;
    sVar2 = 4;
    plVar4 = (long *)0x1e109e;
  }
  if (((sVar1 == 3) && (!bVar5)) && (*(char *)((long)plVar3 + 2) == 'a' && (short)*plVar3 == 0x3776)
     ) {
    bVar5 = true;
    sVar2 = 4;
    plVar4 = (long *)0x1e109e;
  }
  if (((sVar1 == 4) && (!bVar5)) && ((int)*plVar3 == 0x6c683776)) {
    bVar5 = true;
    sVar2 = 4;
    plVar4 = (long *)0x1e109e;
  }
  if (((sVar1 == 3) && (!bVar5)) && (*(char *)((long)plVar3 + 2) == 'l' && (short)*plVar3 == 0x3776)
     ) {
    bVar5 = true;
    sVar2 = 4;
    plVar4 = (long *)0x1e109e;
  }
  if (((sVar1 == 3) && (!bVar5)) && (*(char *)((long)plVar3 + 2) == 'r' && (short)*plVar3 == 0x3776)
     ) {
    bVar5 = true;
    sVar2 = 4;
    plVar4 = (long *)0x1e10b9;
  }
  if (((sVar1 == 3) && (!bVar5)) && (*(char *)((long)plVar3 + 2) == 'm' && (short)*plVar3 == 0x3776)
     ) {
    bVar5 = true;
    sVar2 = 4;
    plVar4 = (long *)0x1e10c9;
  }
  if (((sVar1 == 4) && (!bVar5)) && ((int)*plVar3 == 0x6d653776)) {
    bVar5 = true;
    sVar2 = 5;
    plVar4 = (long *)0x1e10d9;
  }
  if (((sVar1 == 2) && (!bVar5)) && ((short)*plVar3 == 0x3876)) {
    bVar5 = true;
    sVar2 = 4;
    plVar4 = (long *)0x1e10ec;
  }
  if (((sVar1 == 3) && (!bVar5)) && (*(char *)((long)plVar3 + 2) == 'a' && (short)*plVar3 == 0x3876)
     ) {
    bVar5 = true;
    sVar2 = 4;
    plVar4 = (long *)0x1e10ec;
  }
  if (((sVar1 == 3) && (!bVar5)) && (*(char *)((long)plVar3 + 2) == 'l' && (short)*plVar3 == 0x3876)
     ) {
    bVar5 = true;
    sVar2 = 4;
    plVar4 = (long *)0x1e10ec;
  }
  if (((sVar1 == 7) && (!bVar5)) &&
     (*(int *)((long)plVar3 + 3) == 0x34366863 && (int)*plVar3 == 0x63726161)) {
    bVar5 = true;
    sVar2 = 4;
    plVar4 = (long *)0x1e10ec;
  }
  if (((sVar1 == 5) && (!bVar5)) &&
     (*(char *)((long)plVar3 + 4) == '4' && (int)*plVar3 == 0x366d7261)) {
    bVar5 = true;
    sVar2 = 4;
    plVar4 = (long *)0x1e10ec;
  }
  if (((sVar1 == 5) && (!bVar5)) &&
     (*(char *)((long)plVar3 + 4) == 'a' && (int)*plVar3 == 0x312e3876)) {
    bVar5 = true;
    sVar2 = 6;
    plVar4 = (long *)0x1e10f8;
  }
  if (((sVar1 == 5) && (!bVar5)) &&
     (*(char *)((long)plVar3 + 4) == 'a' && (int)*plVar3 == 0x322e3876)) {
    bVar5 = true;
    sVar2 = 6;
    plVar4 = (long *)0x1e1108;
  }
  if (((sVar1 == 5) && (!bVar5)) &&
     (*(char *)((long)plVar3 + 4) == 'a' && (int)*plVar3 == 0x332e3876)) {
    bVar5 = true;
    sVar2 = 6;
    plVar4 = (long *)0x1e1118;
  }
  if (((sVar1 == 5) && (!bVar5)) &&
     (*(char *)((long)plVar3 + 4) == 'a' && (int)*plVar3 == 0x342e3876)) {
    bVar5 = true;
    sVar2 = 6;
    plVar4 = (long *)0x1e1128;
  }
  if (((sVar1 == 3) && (!bVar5)) && (*(char *)((long)plVar3 + 2) == 'r' && (short)*plVar3 == 0x3876)
     ) {
    bVar5 = true;
    sVar2 = 4;
    plVar4 = (long *)0x1e1138;
  }
  if (((sVar1 == 8) && (!bVar5)) && (*plVar3 == 0x657361622e6d3876)) {
    bVar5 = true;
    sVar2 = 9;
    plVar4 = (long *)0x1e1148;
  }
  if (((sVar1 == 8) && (!bVar5)) && (*plVar3 == 0x6e69616d2e6d3876)) {
    bVar5 = true;
    sVar2 = 9;
    plVar4 = (long *)0x1e116b;
  }
  if (bVar5) {
    sVar1 = sVar2;
    plVar3 = plVar4;
  }
  SVar6.Length = sVar1;
  SVar6.Data = (char *)plVar3;
  return SVar6;
}

Assistant:

static StringRef getArchSynonym(StringRef Arch) {
  return StringSwitch<StringRef>(Arch)
      .Case("v5", "v5t")
      .Case("v5e", "v5te")
      .Case("v6j", "v6")
      .Case("v6hl", "v6k")
      .Cases("v6m", "v6sm", "v6s-m", "v6-m")
      .Cases("v6z", "v6zk", "v6kz")
      .Cases("v7", "v7a", "v7hl", "v7l", "v7-a")
      .Case("v7r", "v7-r")
      .Case("v7m", "v7-m")
      .Case("v7em", "v7e-m")
      .Cases("v8", "v8a", "v8l", "aarch64", "arm64", "v8-a")
      .Case("v8.1a", "v8.1-a")
      .Case("v8.2a", "v8.2-a")
      .Case("v8.3a", "v8.3-a")
      .Case("v8.4a", "v8.4-a")
      .Case("v8r", "v8-r")
      .Case("v8m.base", "v8-m.base")
      .Case("v8m.main", "v8-m.main")
      .Default(Arch);
}